

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_quaternion.cpp
# Opt level: O1

bool __thiscall ON_Quaternion::IsValid(ON_Quaternion *this)

{
  if ((((ABS(this->a) < 1.23432101234321e+308) && (ABS(this->b) < 1.23432101234321e+308)) &&
      (ABS(this->c) < 1.23432101234321e+308)) && (-1.23432101234321e+308 < this->d)) {
    return this->d < 1.23432101234321e+308;
  }
  return false;
}

Assistant:

bool ON_Quaternion::IsValid() const
{
  return ((ON_IS_VALID(a) && ON_IS_VALID(b) && ON_IS_VALID(c) && ON_IS_VALID(d)) ? true : false);
}